

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::CuriosityUpright::CuriosityUpright
          (CuriosityUpright *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> _Stack_f8;
  ChVector<double> local_e8;
  ChQuaternion<double> local_c8;
  ChFrame<double> local_a8;
  
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_f8,
             &mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  CuriosityPart::CuriosityPart
            (&this->super_CuriosityPart,name,rel_pos,
             (shared_ptr<chrono::ChMaterialSurface> *)&_Stack_f8,false);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_f8._M_refcount);
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_001a0a40;
  std::__cxx11::string::assign((char *)&(this->super_CuriosityPart).m_mesh_name);
  auVar2._8_4_ = 0x3ecccccd;
  auVar2._0_8_ = 0x3ecccccd3ecccccd;
  auVar2._12_4_ = 0x3ecccccd;
  uVar1 = vmovlps_avx(auVar2);
  (this->super_CuriosityPart).m_color.R = (float)(int)uVar1;
  (this->super_CuriosityPart).m_color.G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->super_CuriosityPart).m_color.B = 0.7;
  (this->super_CuriosityPart).m_mass = 6.0;
  (this->super_CuriosityPart).m_inertia.m_data[0] = 0.042;
  (this->super_CuriosityPart).m_inertia.m_data[1] = 0.042;
  (this->super_CuriosityPart).m_inertia.m_data[2] = 0.024;
  local_c8.m_data[0] = 1.0;
  local_e8.m_data[2] = 0.0;
  local_c8.m_data[3] = 0.0;
  local_e8.m_data[0] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_c8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_a8,&local_e8,&local_c8);
  ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_a8);
  return;
}

Assistant:

CuriosityUpright::CuriosityUpright(const std::string& name,
                                   const ChFrame<>& rel_pos,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, rel_pos, mat, false) {
    m_mesh_name = "curiosity_steer";
    m_color = ChColor(0.4f, 0.4f, 0.7f);

    m_mass = 6;
    m_inertia = ChVector<>(0.007, 0.007, 0.004) * m_mass;
    m_cog = ChFrame<>();
}